

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fork.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  int res_2;
  int res_1;
  exception *e;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  int pid;
  int res;
  int fd [2];
  fork_shared_mutex mutex_;
  int in_stack_ffffffffffffebb4;
  uint local_1220 [4];
  undefined4 local_1210;
  undefined1 local_1209;
  string local_1208 [32];
  ostringstream local_11e8 [383];
  undefined1 local_1069;
  string local_1068 [32];
  ostringstream local_1048 [383];
  undefined1 local_ec9;
  string local_ec8 [32];
  ostringstream local_ea8 [383];
  undefined1 local_d29;
  string local_d28 [32];
  ostringstream local_d08 [383];
  undefined1 local_b89;
  string local_b88 [32];
  ostringstream local_b68 [383];
  undefined1 local_9e9;
  string local_9e8 [32];
  ostringstream local_9c8 [383];
  undefined1 local_849;
  string local_848 [32];
  ostringstream local_828 [383];
  undefined1 local_6a9;
  string local_6a8 [32];
  ostringstream local_688 [383];
  undefined1 local_509;
  string local_508 [32];
  ostringstream local_4e8 [383];
  undefined1 local_369;
  string local_368 [32];
  ostringstream local_348 [383];
  undefined1 local_1c9;
  string local_1c8 [32];
  ostringstream local_1a8 [392];
  __pid_t local_20;
  int local_1c;
  int local_18;
  int local_14;
  fork_shared_mutex local_10 [12];
  int local_4;
  
  local_4 = 0;
  booster::fork_shared_mutex::fork_shared_mutex(local_10);
  local_1c = pipe(&local_18);
  local_20 = fork();
  if (local_20 == 0) {
    close(local_14);
    iVar3 = doread(in_stack_ffffffffffffebb4);
    if (iVar3 != 1) {
      std::__cxx11::ostringstream::ostringstream(local_828);
      poVar4 = std::operator<<((ostream *)local_828,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x46);
      std::operator<<(poVar4," doread(fd[0])==1");
      local_849 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_848);
      local_849 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = booster::fork_shared_mutex::try_lock((fork_shared_mutex *)0x102e65);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_9c8);
      poVar4 = std::operator<<((ostream *)local_9c8,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x47);
      std::operator<<(poVar4," mutex_.try_lock()");
      local_9e9 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_9e8);
      local_9e9 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = doread(in_stack_ffffffffffffebb4);
    if (iVar3 != 1) {
      std::__cxx11::ostringstream::ostringstream(local_b68);
      poVar4 = std::operator<<((ostream *)local_b68,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x48);
      std::operator<<(poVar4," doread(fd[0])==1");
      local_b89 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_b88);
      local_b89 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::fork_shared_mutex::unlock();
    iVar3 = doread(in_stack_ffffffffffffebb4);
    if (iVar3 != 1) {
      std::__cxx11::ostringstream::ostringstream(local_d08);
      poVar4 = std::operator<<((ostream *)local_d08,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4b);
      std::operator<<(poVar4," doread(fd[0])==1");
      local_d29 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_d28);
      local_d29 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar2 = booster::fork_shared_mutex::try_shared_lock();
    if ((bVar2 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_ea8);
      poVar4 = std::operator<<((ostream *)local_ea8,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4c);
      std::operator<<(poVar4," mutex_.try_shared_lock()");
      local_ec9 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_ec8);
      local_ec9 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::fork_shared_mutex::unlock();
    bVar2 = booster::fork_shared_mutex::try_unique_lock();
    if ((bVar2 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1048);
      poVar4 = std::operator<<((ostream *)local_1048,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4e);
      std::operator<<(poVar4," !mutex_.try_unique_lock()");
      local_1069 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_1068);
      local_1069 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::fork_shared_mutex::unique_lock();
    iVar3 = doread(in_stack_ffffffffffffebb4);
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_11e8);
      poVar4 = std::operator<<((ostream *)local_11e8,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x50);
      std::operator<<(poVar4," doread(fd[0])==0");
      local_1209 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_1208);
      local_1209 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    usleep(200000);
    local_4 = 0;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Test try_lock");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    close(local_18);
    usleep(100000);
    dowrite(in_stack_ffffffffffffebb4);
    usleep(100000);
    bVar1 = booster::fork_shared_mutex::try_lock((fork_shared_mutex *)0x1024e3);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar4 = std::operator<<((ostream *)local_1a8,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x33);
      std::operator<<(poVar4," !mutex_.try_lock()");
      local_1c9 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_1c8);
      local_1c9 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    dowrite(in_stack_ffffffffffffebb4);
    usleep(100000);
    bVar1 = booster::fork_shared_mutex::try_lock((fork_shared_mutex *)0x1026c5);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_348);
      poVar4 = std::operator<<((ostream *)local_348,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x36);
      std::operator<<(poVar4," mutex_.try_lock()");
      local_369 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_368);
      local_369 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::fork_shared_mutex::unlock();
    poVar4 = std::operator<<((ostream *)&std::cout,"Test shared/unique");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    booster::fork_shared_mutex::shared_lock();
    dowrite(in_stack_ffffffffffffebb4);
    usleep(100000);
    close(local_14);
    booster::fork_shared_mutex::unlock();
    poVar4 = std::operator<<((ostream *)&std::cout,"Test unlock on exit");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    usleep(100000);
    bVar1 = booster::fork_shared_mutex::try_lock((fork_shared_mutex *)0x10293b);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4e8);
      poVar4 = std::operator<<((ostream *)local_4e8,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x40);
      std::operator<<(poVar4," !mutex_.try_lock()");
      local_509 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_508);
      local_509 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    usleep(500000);
    bVar1 = booster::fork_shared_mutex::try_lock((fork_shared_mutex *)0x102af6);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_688);
      poVar4 = std::operator<<((ostream *)local_688,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x42);
      std::operator<<(poVar4," mutex_.try_lock()");
      local_6a9 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_6a8);
      local_6a9 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_20 == 0) {
      local_4 = 0;
    }
    else {
      wait(local_1220);
      if (((local_1220[0] & 0x7f) == 0) && ((int)(local_1220[0] & 0xff00) >> 8 == 0)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Ok");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
  }
  local_1210 = 1;
  booster::fork_shared_mutex::~fork_shared_mutex(local_10);
  return local_4;
}

Assistant:

int main()
{
	booster::fork_shared_mutex mutex_;
	int fd[2];
	int res =  pipe(fd);
	(void)(res);
	int pid = fork();
	try {
		if(pid!=0) { // parent

			std::cout << "Test try_lock" << std::endl;
			close(fd[0]);
			usleep(100000);
			dowrite(fd[1]);
			usleep(100000);
			TEST(!mutex_.try_lock());
			dowrite(fd[1]);
			usleep(100000);
			TEST(mutex_.try_lock());
			mutex_.unlock();
			std::cout << "Test shared/unique" << std::endl;
			mutex_.shared_lock();
			dowrite(fd[1]);
			usleep(100000);
			close(fd[1]);
			mutex_.unlock();
			std::cout << "Test unlock on exit" << std::endl;
			usleep(100000);
			TEST(!mutex_.try_lock());
			usleep(500000);
			TEST(mutex_.try_lock());
		}
		else { // child
			close(fd[1]);
			TEST(doread(fd[0])==1);
			TEST(mutex_.try_lock());
			TEST(doread(fd[0])==1);
			mutex_.unlock();
			// test 2
			TEST(doread(fd[0])==1);
			TEST(mutex_.try_shared_lock());
			mutex_.unlock();
			TEST(!mutex_.try_unique_lock());
			mutex_.unique_lock();
			TEST(doread(fd[0])==0);
			usleep(200000);
			return 0;
		}
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		if(pid!=0) {
			int res;
			::wait(&res);
		}
		return 1;
	}
	if(pid!=0) {
		int res;
		::wait(&res);
		if(WIFEXITED(res) && WEXITSTATUS(res)==0) {
			std::cerr << "Ok" <<std::endl;
			return 0;
		}
		return 1;
	}
	return 0;
}